

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp_id_GostR3410_2001_TestParamSet.c
# Opt level: O2

int point_mul_id_GostR3410_2001_TestParamSet
              (EC_GROUP *group,EC_POINT *r,EC_POINT *q,BIGNUM *m,BN_CTX *ctx)

{
  uint64_t *puVar1;
  uint64_t *out1;
  uint64_t *out1_00;
  char cVar2;
  int iVar3;
  int iVar4;
  BIGNUM *pBVar5;
  BIGNUM *pBVar6;
  pt_prj_t_conflict *ppVar7;
  int iVar8;
  uint uVar9;
  long lVar10;
  byte arg1;
  bool bVar11;
  uchar b_y [32];
  pt_prj_t_conflict lut;
  uchar b_x [32];
  uchar b_m [32];
  pt_prj_t_conflict Q;
  pt_aff_t_conflict local_6b8;
  int8_t rnaf [52];
  pt_prj_t_conflict local_638 [16];
  
  BN_CTX_start((BN_CTX *)ctx);
  pBVar5 = BN_CTX_get((BN_CTX *)ctx);
  pBVar6 = BN_CTX_get((BN_CTX *)ctx);
  iVar4 = 0;
  iVar8 = 0;
  if ((((pBVar6 != (BIGNUM *)0x0) &&
       (iVar3 = EC_POINT_get_affine_coordinates(group,q,pBVar5,pBVar6,ctx), iVar3 != 0)) &&
      (iVar3 = BN_bn2lebinpad(pBVar5,b_x,0x20), iVar8 = iVar4, iVar3 == 0x20)) &&
     ((iVar4 = BN_bn2lebinpad(pBVar6,b_y,0x20), iVar4 == 0x20 &&
      (iVar4 = BN_bn2lebinpad(m,b_m,0x20), iVar4 == 0x20)))) {
    fiat_id_GostR3410_2001_TestParamSet_from_bytes(local_6b8.X,b_x);
    puVar1 = local_6b8.Y;
    fiat_id_GostR3410_2001_TestParamSet_from_bytes(puVar1,b_y);
    fiat_id_GostR3410_2001_TestParamSet_to_montgomery(local_6b8.X,local_6b8.X);
    fiat_id_GostR3410_2001_TestParamSet_to_montgomery(puVar1,puVar1);
    rnaf[0x20] = '\0';
    rnaf[0x21] = '\0';
    rnaf[0x22] = '\0';
    rnaf[0x23] = '\0';
    rnaf[0x24] = '\0';
    rnaf[0x25] = '\0';
    rnaf[0x26] = '\0';
    rnaf[0x27] = '\0';
    rnaf[0x28] = '\0';
    rnaf[0x29] = '\0';
    rnaf[0x2a] = '\0';
    rnaf[0x2b] = '\0';
    rnaf[0x2c] = '\0';
    rnaf[0x2d] = '\0';
    rnaf[0x2e] = '\0';
    rnaf[0x2f] = '\0';
    rnaf[0x30] = '\0';
    rnaf[0x31] = '\0';
    rnaf[0x32] = '\0';
    rnaf[0x33] = '\0';
    rnaf[0x10] = '\0';
    rnaf[0x11] = '\0';
    rnaf[0x12] = '\0';
    rnaf[0x13] = '\0';
    rnaf[0x14] = '\0';
    rnaf[0x15] = '\0';
    rnaf[0x16] = '\0';
    rnaf[0x17] = '\0';
    rnaf[0x18] = '\0';
    rnaf[0x19] = '\0';
    rnaf[0x1a] = '\0';
    rnaf[0x1b] = '\0';
    rnaf[0x1c] = '\0';
    rnaf[0x1d] = '\0';
    rnaf[0x1e] = '\0';
    rnaf[0x1f] = '\0';
    rnaf[0] = '\0';
    rnaf[1] = '\0';
    rnaf[2] = '\0';
    rnaf[3] = '\0';
    rnaf[4] = '\0';
    rnaf[5] = '\0';
    rnaf[6] = '\0';
    rnaf[7] = '\0';
    rnaf[8] = '\0';
    rnaf[9] = '\0';
    rnaf[10] = '\0';
    rnaf[0xb] = '\0';
    rnaf[0xc] = '\0';
    rnaf[0xd] = '\0';
    rnaf[0xe] = '\0';
    rnaf[0xf] = '\0';
    Q.Z[2] = 0;
    Q.Z[3] = 0;
    Q.Z[0] = 0;
    Q.Z[1] = 0;
    Q.Y[2] = 0;
    Q.Y[3] = 0;
    Q.Y[0] = 0;
    Q.Y[1] = 0;
    Q.X[2] = 0;
    Q.X[3] = 0;
    Q.X[0] = 0;
    Q.X[1] = 0;
    lut.Z[2] = 0;
    lut.Z[3] = 0;
    lut.Z[0] = 0;
    lut.Z[1] = 0;
    lut.Y[2] = 0;
    lut.Y[3] = 0;
    lut.Y[0] = 0;
    lut.Y[1] = 0;
    lut.X[2] = 0;
    lut.X[3] = 0;
    lut.X[0] = 0;
    lut.X[1] = 0;
    ppVar7 = local_638;
    precomp_wnaf(ppVar7,&local_6b8);
    scalar_rwnaf(rnaf,b_m);
    iVar8 = (int)rnaf[0x33];
    for (lVar10 = 0; lVar10 != 0x10; lVar10 = lVar10 + 1) {
      bVar11 = (int)(iVar8 + -1 >> 1 ^ (uint)lVar10) < 1;
      fiat_id_GostR3410_2001_TestParamSet_selectznz(Q.X,bVar11,Q.X,ppVar7->X);
      fiat_id_GostR3410_2001_TestParamSet_selectznz(Q.Y,bVar11,Q.Y,ppVar7->Y);
      fiat_id_GostR3410_2001_TestParamSet_selectznz(Q.Z,bVar11,Q.Z,ppVar7->Z);
      ppVar7 = ppVar7 + 1;
    }
    for (uVar9 = 0x32; -1 < (int)uVar9; uVar9 = uVar9 - 1) {
      iVar8 = 5;
      while (bVar11 = iVar8 != 0, iVar8 = iVar8 + -1, bVar11) {
        point_double(&Q,&Q);
      }
      cVar2 = rnaf[uVar9];
      ppVar7 = local_638;
      for (lVar10 = 0; lVar10 != 0x10; lVar10 = lVar10 + 1) {
        bVar11 = (int)((int)(char)(-1 - (cVar2 >> 7)) + ((int)cVar2 >> 0x1f ^ (int)cVar2) >> 1 ^
                      (uint)lVar10) < 1;
        fiat_id_GostR3410_2001_TestParamSet_selectznz(lut.X,bVar11,lut.X,ppVar7->X);
        fiat_id_GostR3410_2001_TestParamSet_selectznz(lut.Y,bVar11,lut.Y,ppVar7->Y);
        fiat_id_GostR3410_2001_TestParamSet_selectznz(lut.Z,bVar11,lut.Z,ppVar7->Z);
        ppVar7 = ppVar7 + 1;
      }
      puVar1 = lut.Y;
      fiat_id_GostR3410_2001_TestParamSet_opp(local_6b8.Y,puVar1);
      fiat_id_GostR3410_2001_TestParamSet_selectznz
                (puVar1,(byte)(cVar2 >> 7) >> 7,puVar1,local_6b8.Y);
      point_add_proj(&Q,&Q,&lut);
    }
    lut.X[2] = local_638[0].X[2];
    lut.X[3] = local_638[0].X[3];
    lut.X[0] = local_638[0].X[0];
    lut.X[1] = local_638[0].X[1];
    fiat_id_GostR3410_2001_TestParamSet_opp(lut.Y,local_638[0].Y);
    lut.Z[2] = local_638[0].Z[2];
    lut.Z[3] = local_638[0].Z[3];
    lut.Z[0] = local_638[0].Z[0];
    lut.Z[1] = local_638[0].Z[1];
    point_add_proj(&lut,&lut,&Q);
    arg1 = b_m[0] & 1;
    fiat_id_GostR3410_2001_TestParamSet_selectznz(Q.X,arg1,lut.X,Q.X);
    puVar1 = Q.Y;
    fiat_id_GostR3410_2001_TestParamSet_selectznz(puVar1,arg1,lut.Y,puVar1);
    out1 = Q.Z;
    fiat_id_GostR3410_2001_TestParamSet_selectznz(out1,arg1,lut.Z,out1);
    fiat_id_GostR3410_2001_TestParamSet_inv(out1,out1);
    fiat_id_GostR3410_2001_TestParamSet_mul(local_6b8.X,Q.X,out1);
    out1_00 = local_6b8.Y;
    fiat_id_GostR3410_2001_TestParamSet_mul(out1_00,puVar1,out1);
    fiat_id_GostR3410_2001_TestParamSet_from_montgomery(local_6b8.X,local_6b8.X);
    fiat_id_GostR3410_2001_TestParamSet_from_montgomery(out1_00,out1_00);
    fiat_id_GostR3410_2001_TestParamSet_to_bytes(b_x,local_6b8.X);
    fiat_id_GostR3410_2001_TestParamSet_to_bytes(b_y,out1_00);
    iVar8 = CRYPTO_memcmp("",b_x,0x20);
    if ((iVar8 == 0) && (iVar8 = CRYPTO_memcmp("",b_y,0x20), iVar8 == 0)) {
      iVar8 = EC_POINT_set_to_infinity((EC_GROUP *)group,(EC_POINT *)r);
      if (iVar8 == 0) {
        iVar8 = 0;
        goto LAB_0012c279;
      }
    }
    else {
      lVar10 = BN_lebin2bn(b_x,0x20,pBVar5);
      iVar8 = 0;
      if ((lVar10 == 0) ||
         ((lVar10 = BN_lebin2bn(b_y,0x20,pBVar6), lVar10 == 0 ||
          (iVar4 = EC_POINT_set_affine_coordinates(group,r,pBVar5,pBVar6,ctx), iVar4 == 0))))
      goto LAB_0012c279;
    }
    iVar8 = 1;
  }
LAB_0012c279:
  BN_CTX_end((BN_CTX *)ctx);
  return iVar8;
}

Assistant:

int
    point_mul_id_GostR3410_2001_TestParamSet(const EC_GROUP *group, EC_POINT *r,
                                             const EC_POINT *q, const BIGNUM *m,
                                             BN_CTX *ctx) {
    int ret = 0;
    unsigned char b_x[32];
    unsigned char b_y[32];
    unsigned char b_m[32];
    BIGNUM *x = NULL, *y = NULL;

    BN_CTX_start(ctx);
    x = BN_CTX_get(ctx);
    if ((y = BN_CTX_get(ctx)) == NULL
        /* pull out coords as bytes */
        || !EC_POINT_get_affine_coordinates(group, q, x, y, ctx) ||
        BN_bn2lebinpad(x, b_x, 32) != 32 || BN_bn2lebinpad(y, b_y, 32) != 32 ||
        BN_bn2lebinpad(m, b_m, 32) != 32)
        goto err;
    /* do the variable scalar multiplication */
    point_mul(b_x, b_y, b_m, b_x, b_y);
    /* check for infinity */
    if (CRYPTO_memcmp(const_zb, b_x, 32) == 0 &&
        CRYPTO_memcmp(const_zb, b_y, 32) == 0) {
        if (!EC_POINT_set_to_infinity(group, r)) goto err;
    } else {
        /* otherwise, pack the bytes into the result */
        if (BN_lebin2bn(b_x, 32, x) == NULL ||
            BN_lebin2bn(b_y, 32, y) == NULL ||
            !EC_POINT_set_affine_coordinates(group, r, x, y, ctx))
            goto err;
    }
    ret = 1;
err:
    BN_CTX_end(ctx);
    return ret;
}